

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void mi_subproc_delete(mi_subproc_id_t subproc_id)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  int err;
  
  if (subproc_id != (mi_subproc_id_t)0x0) {
    __mutex = (pthread_mutex_t *)((long)subproc_id + 0x10);
    err = pthread_mutex_lock(__mutex);
    if (err != 0) {
      _mi_error_message(err,"internal error: lock cannot be acquired\n");
    }
    lVar1 = *(long *)((long)subproc_id + 0x60);
    pthread_mutex_unlock(__mutex);
    if (lVar1 == 0) {
      pthread_mutex_destroy(__mutex);
      pthread_mutex_destroy((pthread_mutex_t *)((long)subproc_id + 0x38));
      _mi_arena_meta_free(subproc_id,*(mi_memid_t *)((long)subproc_id + 0x70),0x88);
    }
  }
  return;
}

Assistant:

void mi_subproc_delete(mi_subproc_id_t subproc_id) {
  if (subproc_id == NULL) return;
  mi_subproc_t* subproc = _mi_subproc_from_id(subproc_id);
  // check if there are no abandoned segments still..
  bool safe_to_delete = false;
  mi_lock(&subproc->abandoned_os_lock) {
    if (subproc->abandoned_os_list == NULL) {
      safe_to_delete = true;
    }
  }
  if (!safe_to_delete) return;
  // safe to release
  // todo: should we refcount subprocesses?
  mi_lock_done(&subproc->abandoned_os_lock);
  mi_lock_done(&subproc->abandoned_os_visit_lock);
  _mi_arena_meta_free(subproc, subproc->memid, sizeof(mi_subproc_t));
}